

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kalaha.h
# Opt level: O1

void __thiscall KalahaState<(short)6>::do_move(KalahaState<(short)6> *this,Move move)

{
  short sVar1;
  short *psVar2;
  int iVar3;
  short *psVar4;
  ulong uVar5;
  short sVar6;
  ushort uVar7;
  uint uVar8;
  long lVar9;
  uint uVar10;
  int iVar11;
  ulong uVar12;
  
  if (this->player_must_pass == true) {
    if (move != -1) {
      MCTS::assertion_failed
                ("move == pass_move",
                 "/workspace/llm4binary/github/license_c_cmakelists/PetterS[P]monte-carlo-tree-search/games/kalaha.h"
                 ,0x25);
    }
    this->player_must_pass = false;
    iVar3 = this->player_to_move;
  }
  else {
    if (5 < (ushort)move) {
      MCTS::assertion_failed
                ("0 <= move && move < num_bins",
                 "/workspace/llm4binary/github/license_c_cmakelists/PetterS[P]monte-carlo-tree-search/games/kalaha.h"
                 ,0x2b);
    }
    psVar4 = this->player2_bins;
    psVar2 = this->player1_bins;
    if (this->player_to_move == 1) {
      psVar4 = this->player1_bins;
      psVar2 = this->player2_bins;
    }
    if (psVar4[(ushort)move] < 1) {
      MCTS::assertion_failed
                ("lower_bins[move] > 0",
                 "/workspace/llm4binary/github/license_c_cmakelists/PetterS[P]monte-carlo-tree-search/games/kalaha.h"
                 ,0x2e);
    }
    uVar7 = psVar4[(ushort)move];
    psVar4[(ushort)move] = 0;
    iVar3 = this->player_to_move;
    if (0 < (short)uVar7) {
      uVar5 = (ulong)(iVar3 != 1);
      uVar10 = (uint)uVar7;
      do {
        lVar9 = (long)move;
        uVar12 = 4 - (long)move;
        if (move != 5) {
          do {
            sVar1 = psVar4[lVar9 + 1];
            psVar4[lVar9 + 1] = sVar1 + 1;
            sVar6 = (short)uVar10;
            if ((sVar6 == 1) && (sVar1 == 0)) {
              this->player2_bins[uVar5 + 6] =
                   psVar2[uVar12 & 0xffffffff] + this->player2_bins[uVar5 + 6] + 1;
              psVar4[lVar9 + 1] = 0;
              psVar2[uVar12 & 0xffffffff] = 0;
            }
            uVar10 = uVar10 - 1;
            if (3 < (int)lVar9) break;
            uVar12 = uVar12 - 1;
            lVar9 = lVar9 + 1;
          } while (1 < sVar6);
        }
        if ((short)uVar10 == 0) break;
        this->player2_bins[uVar5 + 6] = this->player2_bins[uVar5 + 6] + 1;
        uVar7 = (short)uVar10 - 1;
        uVar8 = (uint)uVar7;
        if (uVar7 == 0) {
          this->player_must_pass = true;
          break;
        }
        if (0 < (short)uVar7) {
          iVar11 = uVar10 - 2;
          if (4 < (ushort)iVar11) {
            iVar11 = 5;
          }
          uVar12 = 0;
          do {
            psVar2[uVar12] = psVar2[uVar12] + 1;
            uVar12 = uVar12 + 1;
          } while ((iVar11 + 1U & 0xffff) != uVar12);
          uVar8 = (uint)uVar7 - (int)uVar12;
        }
        uVar10 = uVar8;
      } while (0 < (short)uVar8);
    }
  }
  this->player_to_move = 3 - iVar3;
  return;
}

Assistant:

void do_move(Move move)
	{
		if (player_must_pass) {
			attest(move == pass_move);
			player_must_pass = false;
			player_to_move = 3 - player_to_move;
			return;
		}

		attest(0 <= move && move < num_bins);
		short* upper_bins = player_to_move == 1 ? player2_bins : player1_bins;
		short* lower_bins = player_to_move == 1 ? player1_bins : player2_bins;
		attest(lower_bins[move] > 0);
		auto seeds = lower_bins[move];
		lower_bins[move] = 0;

		short* lower_store = player_to_move == 1 ? &player1_store : &player2_store;

		while (seeds > 0) {
			// Move along lower bins.
			for (auto m = move + 1; m < num_bins && seeds > 0; ++m) {
				lower_bins[m] += 1;
				seeds -= 1;

				if (seeds == 0) {
					// Land in an empty square with opposite markers?
					auto opposite = num_bins - 1 - m;
					if (lower_bins[m] == 1 /* && upper_bins[opposite] > 0 */) { // Allow null capture?
						// Capture everything
						*lower_store += lower_bins[m] + upper_bins[opposite];
						lower_bins[m] = 0;
						upper_bins[opposite] = 0;
					}
				}
			}

			if (seeds == 0) {
				break;
			}

			// Put a seed in the store.
			*lower_store += 1;
			seeds -= 1;
			if (seeds == 0) {
				// Last seed in store; gets an extra turn.
				player_must_pass = true;
				break;
			}

			// Move along upper bins.
			for (short m = 0; m < num_bins && seeds > 0; ++m) {
				upper_bins[m] += 1;
				seeds -= 1;
			}
		}

		player_to_move = 3 - player_to_move;
	}